

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

void __thiscall wasm::DAEScanner::visitCall(DAEScanner *this,Call *curr)

{
  bool bVar1;
  Module *this_00;
  Function *this_01;
  mapped_type *this_02;
  Call *local_18;
  Call *curr_local;
  DAEScanner *this_local;
  
  local_18 = curr;
  curr_local = (Call *)this;
  this_00 = Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::getModule
                      (&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                        ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                        .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>);
  this_01 = Module::getFunction(this_00,(Name)(local_18->target).super_IString.str);
  bVar1 = Importable::imported(&this_01->super_Importable);
  if (!bVar1) {
    this_02 = std::
              unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
              ::operator[](&this->info->calls,&local_18->target);
    std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::push_back(this_02,&local_18);
  }
  if ((local_18->isReturn & 1U) != 0) {
    this->info->hasTailCalls = true;
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert(&this->info->tailCallees,&local_18->target);
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    if (!getModule()->getFunction(curr->target)->imported()) {
      info->calls[curr->target].push_back(curr);
    }
    if (curr->isReturn) {
      info->hasTailCalls = true;
      info->tailCallees.insert(curr->target);
    }
  }